

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setup_connection_internals(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  Curl_handler *pCVar3;
  
  pCVar1 = conn->data;
  (*Curl_cfree)((pCVar1->req).protop);
  (pCVar1->req).protop = (void *)0x0;
  (*Curl_cfree)((pCVar1->req).newurl);
  memset(&pCVar1->req,0,0x1a8);
  (pCVar1->req).maxdownload = -1;
  conn->socktype = 1;
  pCVar3 = conn->handler;
  if (pCVar3->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar2 = (*pCVar3->setup_connection)(conn);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pCVar3 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCVar3->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_connection_internals(struct connectdata *conn)
{
  const struct Curl_handler * p;
  CURLcode result;
  struct Curl_easy *data = conn->data;

  /* in some case in the multi state-machine, we go back to the CONNECT state
     and then a second (or third or...) call to this function will be made
     without doing a DISCONNECT or DONE in between (since the connection is
     yet in place) and therefore this function needs to first make sure
     there's no lingering previous data allocated. */
  Curl_free_request_state(data);

  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  conn->socktype = SOCK_STREAM; /* most of them are TCP streams */

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(conn);

    if(result)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->port = p->defport;

  return CURLE_OK;
}